

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::FboOutputAttacher::setupContainer
          (FboOutputAttacher *this,GLuint seed,GLuint fbo)

{
  Context *ctx;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  ContextWrapper *this_01;
  double __x;
  MessageBuilder local_198;
  GLuint local_18;
  GLuint local_14;
  GLuint fbo_local;
  GLuint seed_local;
  FboOutputAttacher *this_local;
  
  this_01 = &(this->super_OutputAttacher).super_ContextWrapper;
  local_18 = fbo;
  local_14 = seed;
  _fbo_local = this;
  ctx = ContextWrapper::getContext(this_01);
  setupFbo(ctx,local_14,local_18);
  ContextWrapper::log(this_01,__x);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [24])"// Drew to framebuffer ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])0x126adde);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_14);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x128e7c9);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

void FboOutputAttacher::setupContainer (GLuint seed, GLuint fbo)
{
	setupFbo(getContext(), seed, fbo);
	log() << TestLog::Message
		  << "// Drew to framebuffer " << fbo << " with seed " << seed << "."
		  << TestLog::EndMessage;
}